

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

bool __thiscall
slang::ast::DiagnosticVisitor::handleDefault<slang::ast::UntypedType>
          (DiagnosticVisitor *this,UntypedType *symbol)

{
  bool bVar1;
  DeclaredType *pDVar2;
  Symbol *in_RSI;
  DiagnosticVisitor *in_RDI;
  DeclaredType *declaredType;
  DeclaredType *in_stack_00000020;
  DeclaredType *in_stack_00000050;
  undefined1 local_1;
  
  bVar1 = finishedEarly(in_RDI);
  if (bVar1) {
    local_1 = false;
  }
  else {
    pDVar2 = Symbol::getDeclaredType(in_RSI);
    if (pDVar2 != (DeclaredType *)0x0) {
      DeclaredType::getType(in_stack_00000050);
      DeclaredType::getInitializer(in_stack_00000020);
    }
    ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false>::
    visitDefault<slang::ast::UntypedType>
              ((ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false> *)in_RDI,
               (UntypedType *)in_RSI);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool handleDefault(const T& symbol) {
        if (finishedEarly())
            return false;

        if constexpr (std::is_base_of_v<Symbol, T>) {
            auto declaredType = symbol.getDeclaredType();
            if (declaredType) {
                declaredType->getType();
                declaredType->getInitializer();
            }

            if constexpr (std::is_same_v<EnumValueSymbol, T> ||
                          std::is_same_v<SpecparamSymbol, T>) {
                symbol.getValue();
            }
        }

        if constexpr (requires { symbol.getBody().bad(); }) {
            auto& body = symbol.getBody();
            if (body.bad())
                return true;

            body.visit(*this);
        }

        visitDefault(symbol);
        return true;
    }